

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

void do_warn(dmr_C *C,char *type,position pos,char *fmt,__va_list_tag *args)

{
  char *pcVar1;
  
  vsprintf(do_warn::buffer,fmt,args);
  pcVar1 = dmrC_stream_name(C,(uint)((ulong)pos >> 6) & 0x3fff);
  fprintf(_stderr,"%s:%d:%d: %s%s\n",pcVar1,(ulong)(pos._4_4_ & 0x7fffffff),
          (ulong)pos >> 0x16 & 0x3ff,type,do_warn::buffer);
  return;
}

Assistant:

static void do_warn(struct dmr_C *C, const char *type, struct position pos,
		    const char *fmt, va_list args)
{
	static char buffer[512];
	const char *name;

	vsprintf(buffer, fmt, args);
	name = dmrC_stream_name(C, pos.stream);

	fprintf(stderr, "%s:%d:%d: %s%s\n", name, pos.line, pos.pos, type,
		buffer);
}